

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

TypeAliasType * __thiscall
slang::BumpAllocator::
emplace<slang::ast::TypeAliasType,char_const(&)[6],slang::SourceLocation_const&>
          (BumpAllocator *this,char (*args) [6],SourceLocation *args_1)

{
  TypeAliasType *this_00;
  size_t sVar1;
  string_view name;
  
  this_00 = (TypeAliasType *)allocate(this,0x98,8);
  sVar1 = strlen(*args);
  name._M_str = *args;
  name._M_len = sVar1;
  ast::TypeAliasType::TypeAliasType(this_00,name,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }